

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.h
# Opt level: O1

bool __thiscall Settings::load(Settings *this,char *file_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  _Alloc_hider __nptr;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  uint64_t uVar7;
  int *piVar8;
  long lVar9;
  undefined8 uVar10;
  uint uVar11;
  IniFile settingsFile;
  string local_b90;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_b70;
  pointer local_b38;
  string local_b30;
  string local_b10;
  undefined1 *local_af0;
  long local_ae8;
  undefined1 local_ae0 [16];
  undefined1 *local_ad0;
  long local_ac8;
  undefined1 local_ac0 [16];
  string local_ab0;
  string local_a90;
  string local_a70;
  string local_a50;
  string local_a30;
  string local_a10;
  string local_9f0;
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_b70._M_buckets = &local_b70._M_single_bucket;
  local_b70._M_bucket_count = 1;
  local_b70._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b70._M_element_count = 0;
  local_b70._M_rehash_policy._M_max_load_factor = 1.0;
  local_b70._M_rehash_policy._M_next_resize = 0;
  local_b70._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::string::string((string *)&local_50,file_name,(allocator *)&local_b90);
  bVar3 = utils::IniFile::readFile((IniFile *)&local_b70,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to load settings, using defaults",0x27);
  }
  local_ad0 = local_ac0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"settings","");
  paVar1 = &local_b90.field_2;
  local_b90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b90,local_ad0,local_ad0 + local_ac8);
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&s_debugSection);
  if (iVar4 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_b90._M_dataplus._M_p,local_b90._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b90._M_dataplus._M_p != paVar1) {
      operator_delete(local_b90._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Loading settings file",0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    if (file_name == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x11e378);
    }
    else {
      sVar6 = strlen(file_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,file_name,sVar6);
    }
    DebugStream::~DebugStream((DebugStream *)&local_b38);
    if (local_ad0 != local_ac0) {
      operator_delete(local_ad0);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Load","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"usr_operator_path","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"../build/usr_operators/libusr_operators.so","");
    utils::IniFile::getString(&local_b90,(IniFile *)&local_b70,&local_70,&local_90,&local_b0);
    std::__cxx11::string::operator=((string *)this,(string *)&local_b90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b90._M_dataplus._M_p != paVar1) {
      operator_delete(local_b90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Load","");
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"usr_class_path","");
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"./V1.2/user.classes.replicode","");
    utils::IniFile::getString(&local_b90,(IniFile *)&local_b70,&local_d0,&local_f0,&local_110);
    std::__cxx11::string::operator=((string *)&this->usr_class_path,(string *)&local_b90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b90._M_dataplus._M_p != paVar1) {
      operator_delete(local_b90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Load","");
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"source_file_name","");
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"./V1.2/test.2.replicode","");
    utils::IniFile::getString(&local_b90,(IniFile *)&local_b70,&local_130,&local_150,&local_170);
    std::__cxx11::string::operator=((string *)&this->source_file_name,(string *)&local_b90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b90._M_dataplus._M_p != paVar1) {
      operator_delete(local_b90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    iVar5 = std::thread::hardware_concurrency();
    local_af0 = local_ae0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_af0,"settings","");
    local_b90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b90,local_af0,local_af0 + local_ae8);
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)&s_debugSection);
    if (iVar4 != 0) goto LAB_00110b6c;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_b90._M_dataplus._M_p,local_b90._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b90._M_dataplus._M_p != paVar1) {
      operator_delete(local_b90._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"number of CPU cores available:",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    DebugStream::~DebugStream((DebugStream *)&local_b38);
    if (local_af0 != local_ae0) {
      operator_delete(local_af0);
    }
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Init","");
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"base_period","");
    uVar7 = utils::IniFile::getInt((IniFile *)&local_b70,&local_190,&local_1b0,50000);
    this->base_period = uVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"Init","");
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"reduction_core_count","");
    uVar11 = (uint)(iVar5 * 3) >> 2;
    uVar7 = utils::IniFile::getInt((IniFile *)&local_b70,&local_1d0,&local_1f0,(ulong)(uVar11 + 1));
    this->reduction_core_count = uVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Init","");
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"time_core_count","");
    uVar7 = utils::IniFile::getInt
                      ((IniFile *)&local_b70,&local_210,&local_230,(ulong)((iVar5 - uVar11) + 1));
    this->time_core_count = uVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"System","");
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"mdl_inertia_sr_thr","");
    dVar2 = utils::IniFile::getDouble((IniFile *)&local_b70,&local_250,&local_270,0.9);
    this->mdl_inertia_sr_thr = dVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"System","");
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"mdl_inertia_cnt_thr","");
    uVar7 = utils::IniFile::getInt((IniFile *)&local_b70,&local_290,&local_2b0,6);
    this->mdl_inertia_cnt_thr = uVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p);
    }
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"System","");
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"tpx_dsr_thr","");
    dVar2 = utils::IniFile::getDouble((IniFile *)&local_b70,&local_2d0,&local_2f0,0.1);
    this->tpx_dsr_thr = dVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"System","");
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"min_sim_time_horizon","");
    uVar7 = utils::IniFile::getInt((IniFile *)&local_b70,&local_310,&local_330,0);
    this->min_sim_time_horizon = uVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p);
    }
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"System","");
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"max_sim_time_horizon","");
    uVar7 = utils::IniFile::getInt((IniFile *)&local_b70,&local_350,&local_370,0);
    this->max_sim_time_horizon = uVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p);
    }
    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"System","");
    local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"sim_time_horizon","");
    dVar2 = utils::IniFile::getDouble((IniFile *)&local_b70,&local_390,&local_3b0,0.3);
    this->sim_time_horizon = dVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p);
    }
    local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"System","");
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"tpx_time_horizon","");
    uVar7 = utils::IniFile::getInt((IniFile *)&local_b70,&local_3d0,&local_3f0,500000);
    this->tpx_time_horizon = uVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
      operator_delete(local_3d0._M_dataplus._M_p);
    }
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"System","");
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"perf_sampling_period","");
    uVar7 = utils::IniFile::getInt((IniFile *)&local_b70,&local_410,&local_430,250000);
    this->perf_sampling_period = uVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p);
    }
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"System","");
    local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"float_tolerance","");
    dVar2 = utils::IniFile::getDouble((IniFile *)&local_b70,&local_450,&local_470,1e-05);
    this->float_tolerance = dVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      operator_delete(local_470._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p);
    }
    local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"System","");
    local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"time_tolerance","");
    uVar7 = utils::IniFile::getInt((IniFile *)&local_b70,&local_490,&local_4b0,10000);
    this->time_tolerance = uVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p != &local_490.field_2) {
      operator_delete(local_490._M_dataplus._M_p);
    }
    local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"System","");
    local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"primary_thz","");
    uVar7 = utils::IniFile::getInt((IniFile *)&local_b70,&local_4d0,&local_4f0,3600000);
    this->primary_thz = uVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
      operator_delete(local_4f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
      operator_delete(local_4d0._M_dataplus._M_p);
    }
    local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"System","");
    local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"secondary_thz","");
    uVar7 = utils::IniFile::getInt((IniFile *)&local_b70,&local_510,&local_530,7200000);
    this->secondary_thz = uVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_530._M_dataplus._M_p != &local_530.field_2) {
      operator_delete(local_530._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_510._M_dataplus._M_p != &local_510.field_2) {
      operator_delete(local_510._M_dataplus._M_p);
    }
    local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"Debug","");
    local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"debug","");
    iVar4 = utils::IniFile::getBool((IniFile *)&local_b70,&local_550,&local_570,true);
    this->debug = iVar4 != 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570._M_dataplus._M_p != &local_570.field_2) {
      operator_delete(local_570._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_550._M_dataplus._M_p != &local_550.field_2) {
      operator_delete(local_550._M_dataplus._M_p);
    }
    local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"Debug","");
    local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"debug_windows","");
    uVar7 = utils::IniFile::getInt((IniFile *)&local_b70,&local_590,&local_5b0,1);
    this->debug_windows = uVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
      operator_delete(local_5b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._M_dataplus._M_p != &local_590.field_2) {
      operator_delete(local_590._M_dataplus._M_p);
    }
    local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d0,"Debug","");
    local_b10._M_dataplus._M_p = (pointer)&local_b10.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b10,"trace_levels","");
    local_b30._M_dataplus._M_p = (pointer)&local_b30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b30,"CC","");
    utils::IniFile::getString(&local_b90,(IniFile *)&local_b70,&local_5d0,&local_b10,&local_b30);
    __nptr._M_p = local_b90._M_dataplus._M_p;
    piVar8 = __errno_location();
    iVar4 = *piVar8;
    *piVar8 = 0;
    lVar9 = strtol(__nptr._M_p,&local_b38,0x10);
    if (local_b38 != __nptr._M_p) {
      if (((int)lVar9 == lVar9) && (*piVar8 != 0x22)) {
        if (*piVar8 == 0) {
          *piVar8 = iVar4;
        }
        this->trace_levels = (long)(int)lVar9;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b90._M_dataplus._M_p != &local_b90.field_2) {
          operator_delete(local_b90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b30._M_dataplus._M_p != &local_b30.field_2) {
          operator_delete(local_b30._M_dataplus._M_p);
        }
        paVar1 = &local_b90.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b10._M_dataplus._M_p != &local_b10.field_2) {
          operator_delete(local_b10._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
          operator_delete(local_5d0._M_dataplus._M_p);
        }
        local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f0,"Resilience","");
        local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_610,"ntf_mk_resilience","")
        ;
        uVar7 = utils::IniFile::getInt((IniFile *)&local_b70,&local_5f0,&local_610,1);
        this->ntf_mk_resilience = uVar7;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_610._M_dataplus._M_p != &local_610.field_2) {
          operator_delete(local_610._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
          operator_delete(local_5f0._M_dataplus._M_p);
        }
        local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"Resilience","");
        local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_650,"goal_pred_success_resilience","");
        uVar7 = utils::IniFile::getInt((IniFile *)&local_b70,&local_630,&local_650,1000);
        this->goal_pred_success_resilience = uVar7;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_650._M_dataplus._M_p != &local_650.field_2) {
          operator_delete(local_650._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_630._M_dataplus._M_p != &local_630.field_2) {
          operator_delete(local_630._M_dataplus._M_p);
        }
        local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"Objects","");
        local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_690,"get_objects","");
        iVar4 = utils::IniFile::getBool((IniFile *)&local_b70,&local_670,&local_690,false);
        this->get_objects = iVar4 != 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_690._M_dataplus._M_p != &local_690.field_2) {
          operator_delete(local_690._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_670._M_dataplus._M_p != &local_670.field_2) {
          operator_delete(local_670._M_dataplus._M_p);
        }
        local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b0,"Objects","");
        local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d0,"decompile_objects","")
        ;
        iVar4 = utils::IniFile::getBool((IniFile *)&local_b70,&local_6b0,&local_6d0,false);
        this->decompile_objects = iVar4 != 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
          operator_delete(local_6d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
          operator_delete(local_6b0._M_dataplus._M_p);
        }
        local_6f0._M_dataplus._M_p = (pointer)&local_6f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f0,"Objects","");
        local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_710,"decompile_to_file","")
        ;
        iVar4 = utils::IniFile::getBool((IniFile *)&local_b70,&local_6f0,&local_710,false);
        this->decompile_to_file = iVar4 != 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_710._M_dataplus._M_p != &local_710.field_2) {
          operator_delete(local_710._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
          operator_delete(local_6f0._M_dataplus._M_p);
        }
        local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_730,"Objects","");
        local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_750,"decompilation_file_path","");
        local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_770,"../Test/decompiled.replicode","");
        utils::IniFile::getString(&local_b90,(IniFile *)&local_b70,&local_730,&local_750,&local_770)
        ;
        std::__cxx11::string::operator=
                  ((string *)&this->decompilation_file_path,(string *)&local_b90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b90._M_dataplus._M_p != paVar1) {
          operator_delete(local_b90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_770._M_dataplus._M_p != &local_770.field_2) {
          operator_delete(local_770._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_750._M_dataplus._M_p != &local_750.field_2) {
          operator_delete(local_750._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_730._M_dataplus._M_p != &local_730.field_2) {
          operator_delete(local_730._M_dataplus._M_p);
        }
        local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"Objects","");
        local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_7b0,"ignore_named_objects","");
        iVar4 = utils::IniFile::getBool((IniFile *)&local_b70,&local_790,&local_7b0,false);
        this->ignore_named_objects = iVar4 != 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
          operator_delete(local_7b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_790._M_dataplus._M_p != &local_790.field_2) {
          operator_delete(local_790._M_dataplus._M_p);
        }
        local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d0,"Objects","");
        local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"write_objects","");
        iVar4 = utils::IniFile::getBool((IniFile *)&local_b70,&local_7d0,&local_7f0,false);
        this->write_objects = iVar4 != 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
          operator_delete(local_7f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
          operator_delete(local_7d0._M_dataplus._M_p);
        }
        local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"Objects","");
        local_830._M_dataplus._M_p = (pointer)&local_830.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_830,"objects_path","");
        local_850._M_dataplus._M_p = (pointer)&local_850.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_850,"objects.image","");
        utils::IniFile::getString(&local_b90,(IniFile *)&local_b70,&local_810,&local_830,&local_850)
        ;
        std::__cxx11::string::operator=((string *)&this->objects_path,(string *)&local_b90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b90._M_dataplus._M_p != paVar1) {
          operator_delete(local_b90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_850._M_dataplus._M_p != &local_850.field_2) {
          operator_delete(local_850._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_830._M_dataplus._M_p != &local_830.field_2) {
          operator_delete(local_830._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_810._M_dataplus._M_p != &local_810.field_2) {
          operator_delete(local_810._M_dataplus._M_p);
        }
        local_870._M_dataplus._M_p = (pointer)&local_870.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_870,"Objects","");
        local_890._M_dataplus._M_p = (pointer)&local_890.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_890,"test_objects","");
        iVar4 = utils::IniFile::getBool((IniFile *)&local_b70,&local_870,&local_890,false);
        this->test_objects = iVar4 != 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_890._M_dataplus._M_p != &local_890.field_2) {
          operator_delete(local_890._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_870._M_dataplus._M_p != &local_870.field_2) {
          operator_delete(local_870._M_dataplus._M_p);
        }
        local_8b0._M_dataplus._M_p = (pointer)&local_8b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b0,"Run","");
        local_8d0._M_dataplus._M_p = (pointer)&local_8d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"run_time","");
        uVar7 = utils::IniFile::getInt((IniFile *)&local_b70,&local_8b0,&local_8d0,0x2760);
        this->run_time = uVar7;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8d0._M_dataplus._M_p != &local_8d0.field_2) {
          operator_delete(local_8d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8b0._M_dataplus._M_p != &local_8b0.field_2) {
          operator_delete(local_8b0._M_dataplus._M_p);
        }
        local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f0,"Run","");
        local_910._M_dataplus._M_p = (pointer)&local_910.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_910,"probe_level","");
        uVar7 = utils::IniFile::getInt((IniFile *)&local_b70,&local_8f0,&local_910,2);
        this->probe_level = uVar7;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_910._M_dataplus._M_p != &local_910.field_2) {
          operator_delete(local_910._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
          operator_delete(local_8f0._M_dataplus._M_p);
        }
        local_930._M_dataplus._M_p = (pointer)&local_930.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_930,"Models","");
        local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_950,"get_models","");
        iVar4 = utils::IniFile::getBool((IniFile *)&local_b70,&local_930,&local_950,false);
        this->get_models = iVar4 != 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_950._M_dataplus._M_p != &local_950.field_2) {
          operator_delete(local_950._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_930._M_dataplus._M_p != &local_930.field_2) {
          operator_delete(local_930._M_dataplus._M_p);
        }
        local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_970,"Models","");
        local_990._M_dataplus._M_p = (pointer)&local_990.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_990,"decompile_models","");
        iVar4 = utils::IniFile::getBool((IniFile *)&local_b70,&local_970,&local_990,false);
        this->decompile_models = iVar4 != 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_990._M_dataplus._M_p != &local_990.field_2) {
          operator_delete(local_990._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_970._M_dataplus._M_p != &local_970.field_2) {
          operator_delete(local_970._M_dataplus._M_p);
        }
        local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_9b0,"Models","");
        local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_9d0,"ignore_named_models","");
        iVar4 = utils::IniFile::getBool((IniFile *)&local_b70,&local_9b0,&local_9d0,false);
        this->ignore_named_models = iVar4 != 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
          operator_delete(local_9d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
          operator_delete(local_9b0._M_dataplus._M_p);
        }
        local_9f0._M_dataplus._M_p = (pointer)&local_9f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_9f0,"Models","");
        local_a10._M_dataplus._M_p = (pointer)&local_a10.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a10,"models_path","");
        local_a30._M_dataplus._M_p = (pointer)&local_a30.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a30,"models.image","");
        utils::IniFile::getString(&local_b90,(IniFile *)&local_b70,&local_9f0,&local_a10,&local_a30)
        ;
        std::__cxx11::string::operator=((string *)&this->models_path,(string *)&local_b90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b90._M_dataplus._M_p != paVar1) {
          operator_delete(local_b90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a30._M_dataplus._M_p != &local_a30.field_2) {
          operator_delete(local_a30._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a10._M_dataplus._M_p != &local_a10.field_2) {
          operator_delete(local_a10._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
          operator_delete(local_9f0._M_dataplus._M_p);
        }
        local_a50._M_dataplus._M_p = (pointer)&local_a50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a50,"Models","");
        local_a70._M_dataplus._M_p = (pointer)&local_a70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a70,"write_models","");
        iVar4 = utils::IniFile::getBool((IniFile *)&local_b70,&local_a50,&local_a70,false);
        this->write_models = iVar4 != 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
          operator_delete(local_a70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a50._M_dataplus._M_p != &local_a50.field_2) {
          operator_delete(local_a50._M_dataplus._M_p);
        }
        local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,"Models","");
        local_ab0._M_dataplus._M_p = (pointer)&local_ab0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_ab0,"test_models","");
        iVar4 = utils::IniFile::getBool((IniFile *)&local_b70,&local_a90,&local_ab0,false);
        this->test_models = iVar4 != 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ab0._M_dataplus._M_p != &local_ab0.field_2) {
          operator_delete(local_ab0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
          operator_delete(local_a90._M_dataplus._M_p);
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_b70);
        return true;
      }
      goto LAB_00110b7f;
    }
  }
  else {
    iVar4 = std::__throw_system_error(iVar4);
LAB_00110b6c:
    std::__throw_system_error(iVar4);
  }
  std::__throw_invalid_argument("stoi");
LAB_00110b7f:
  uVar10 = std::__throw_out_of_range("stoi");
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_b70);
  _Unwind_Resume(uVar10);
}

Assistant:

bool load(const char *file_name)
    {
        utils::IniFile settingsFile;

        if (!settingsFile.readFile(file_name)) {
            std::cerr << "Unable to load settings, using defaults";
        }

        ::debug("settings") << "Loading settings file" << file_name;
        usr_operator_path = settingsFile.getString("Load", "usr_operator_path", "../build/usr_operators/libusr_operators.so");
        usr_class_path = settingsFile.getString("Load", "usr_class_path", "./V1.2/user.classes.replicode");
        source_file_name = settingsFile.getString("Load", "source_file_name",  "./V1.2/test.2.replicode");
        unsigned int cores = std::thread::hardware_concurrency();
        ::debug("settings") << "number of CPU cores available:" << cores;
        base_period = settingsFile.getInt("Init", "base_period", 50000);
        reduction_core_count = settingsFile.getInt("Init", "reduction_core_count", (cores * 3) / 4 + 1);
        time_core_count = settingsFile.getInt("Init", "time_core_count", (cores - ((cores * 3) / 4)) + 1);
        mdl_inertia_sr_thr = settingsFile.getDouble("System", "mdl_inertia_sr_thr", 0.9);
        mdl_inertia_cnt_thr = settingsFile.getInt("System", "mdl_inertia_cnt_thr", 6);
        tpx_dsr_thr = settingsFile.getDouble("System", "tpx_dsr_thr", 0.1);
        min_sim_time_horizon = settingsFile.getInt("System", "min_sim_time_horizon", 0);
        max_sim_time_horizon = settingsFile.getInt("System", "max_sim_time_horizon", 0);
        sim_time_horizon = settingsFile.getDouble("System", "sim_time_horizon", 0.3);
        tpx_time_horizon = settingsFile.getInt("System", "tpx_time_horizon", 500000);
        perf_sampling_period = settingsFile.getInt("System", "perf_sampling_period", 250000);
        float_tolerance = settingsFile.getDouble("System", "float_tolerance", 0.00001);
        time_tolerance = settingsFile.getInt("System", "time_tolerance", 10000);
        primary_thz = settingsFile.getInt("System", "primary_thz", 3600000);
        secondary_thz = settingsFile.getInt("System", "secondary_thz", 7200000);
        this->debug = settingsFile.getBool("Debug", "debug", true);
        debug_windows = settingsFile.getInt("Debug", "debug_windows", 1);
        trace_levels = std::stoi(settingsFile.getString("Debug", "trace_levels", "CC"), nullptr, 16);
        ntf_mk_resilience = settingsFile.getInt("Resilience",  "ntf_mk_resilience", 1);
        goal_pred_success_resilience = settingsFile.getInt("Resilience", "goal_pred_success_resilience", 1000);
        get_objects = settingsFile.getBool("Objects", "get_objects", false);
        decompile_objects = settingsFile.getBool("Objects", "decompile_objects", false);
        decompile_to_file = settingsFile.getBool("Objects", "decompile_to_file", false);
        decompilation_file_path = settingsFile.getString("Objects", "decompilation_file_path", "../Test/decompiled.replicode");
        ignore_named_objects = settingsFile.getBool("Objects", "ignore_named_objects", false);
        write_objects = settingsFile.getBool("Objects", "write_objects", false);
        objects_path = settingsFile.getString("Objects", "objects_path", "objects.image");
        test_objects = settingsFile.getBool("Objects", "test_objects", false);
        run_time = settingsFile.getInt("Run", "run_time", 10080);
        probe_level = settingsFile.getInt("Run", "probe_level", 2);
        get_models = settingsFile.getBool("Models", "get_models", false);
        decompile_models = settingsFile.getBool("Models", "decompile_models", false);
        ignore_named_models = settingsFile.getBool("Models", "ignore_named_models", false);
        models_path = settingsFile.getString("Models", "models_path", "models.image");
        write_models = settingsFile.getBool("Models", "write_models", false);
        test_models = settingsFile.getBool("Models", "test_models", false);
        return true;
    }